

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

void __thiscall llvm::Triple::setVendorName(Triple *this,StringRef Str)

{
  Child LHS;
  Child CVar1;
  Child CVar2;
  Child CVar3;
  NodeKind NVar4;
  Child CVar5;
  Child CVar6;
  Child local_108 [2];
  undefined2 local_f8;
  undefined6 uStack_f6;
  Child local_e8 [2];
  undefined2 local_d8;
  undefined6 uStack_d6;
  Twine local_c8;
  undefined4 local_b0;
  undefined4 uStack_ac;
  NodeKind local_a0;
  char cStack_9f;
  undefined6 uStack_9e;
  uint local_98;
  undefined4 uStack_94;
  NodeKind local_88;
  char cStack_87;
  undefined6 uStack_86;
  uint local_80;
  undefined4 uStack_7c;
  NodeKind local_70;
  char cStack_6f;
  undefined6 uStack_6e;
  uint local_68;
  undefined4 uStack_64;
  NodeKind local_58;
  char cStack_57;
  undefined6 uStack_56;
  StringRef local_50;
  StringRef local_40;
  StringRef local_30;
  
  local_30.Length = Str.Length;
  local_30.Data = Str.Data;
  local_40 = getArchName(this);
  Twine::Twine((Twine *)&local_68,&local_40,"-");
  Twine::Twine((Twine *)&local_80,&local_30);
  if ((local_58 == NullKind) || (local_70 == NullKind)) {
    local_f8 = 0x100;
  }
  else if (local_58 == EmptyKind) {
    local_f8._1_1_ = cStack_6f;
    local_f8._0_1_ = local_70;
    uStack_f6 = uStack_6e;
    local_108[0]._0_4_ = local_80;
    local_108[0]._4_4_ = uStack_7c;
  }
  else if (local_70 == EmptyKind) {
    local_f8._1_1_ = cStack_57;
    local_f8._0_1_ = local_58;
    uStack_f6 = uStack_56;
    local_108[0]._0_4_ = local_68;
    local_108[0]._4_4_ = uStack_64;
  }
  else {
    CVar5._4_4_ = uStack_64;
    CVar5.decUI = local_68;
    if (cStack_57 != '\x01') {
      local_58 = TwineKind;
      CVar5.twine = (Twine *)&local_68;
    }
    if (cStack_6f != '\x01') {
      local_70 = TwineKind;
    }
    CVar3._4_4_ = uStack_7c;
    CVar3.decUI = local_80;
    CVar6.twine = (Twine *)&local_80;
    if (cStack_6f == '\x01') {
      CVar6 = CVar3;
    }
    Twine::Twine((Twine *)local_108,CVar5,local_58,CVar6,local_70);
  }
  Twine::Twine((Twine *)&local_98,"-");
  if (((NodeKind)local_f8 == NullKind) || (local_88 == NullKind)) {
    local_d8 = 0x100;
  }
  else if ((NodeKind)local_f8 == EmptyKind) {
    local_d8._1_1_ = cStack_87;
    local_d8._0_1_ = local_88;
    uStack_d6 = uStack_86;
    local_e8[0]._0_4_ = local_98;
    local_e8[0]._4_4_ = uStack_94;
  }
  else if (local_88 == EmptyKind) {
    local_d8._0_1_ = (NodeKind)local_f8;
    local_d8._1_1_ = local_f8._1_1_;
    uStack_d6 = uStack_f6;
    local_e8[0].decUI = local_108[0].decUI;
    local_e8[0]._4_4_ = local_108[0]._4_4_;
  }
  else {
    CVar6._4_4_ = local_108[0]._4_4_;
    CVar6.decUI = local_108[0].decUI;
    NVar4 = (NodeKind)local_f8;
    if (local_f8._1_1_ != EmptyKind) {
      CVar6.twine = (Twine *)local_108;
      NVar4 = TwineKind;
    }
    if (cStack_87 != '\x01') {
      local_88 = TwineKind;
    }
    CVar2._4_4_ = uStack_94;
    CVar2.decUI = local_98;
    CVar5.twine = (Twine *)&local_98;
    if (cStack_87 == '\x01') {
      CVar5 = CVar2;
    }
    Twine::Twine((Twine *)local_e8,CVar6,NVar4,CVar5,local_88);
  }
  local_50 = getOSAndEnvironmentName(this);
  Twine::Twine((Twine *)&local_b0,&local_50);
  if (((NodeKind)local_d8 == NullKind) || (local_a0 == NullKind)) {
    local_c8._16_2_ = 0x100;
  }
  else if ((NodeKind)local_d8 == EmptyKind) {
    local_c8.RHSKind = cStack_9f;
    local_c8.LHSKind = local_a0;
    local_c8._18_6_ = uStack_9e;
  }
  else if (local_a0 == EmptyKind) {
    local_c8.LHSKind = (NodeKind)local_d8;
    local_c8.RHSKind = local_d8._1_1_;
    local_c8._18_6_ = uStack_d6;
  }
  else {
    LHS._4_4_ = local_e8[0]._4_4_;
    LHS.decUI = local_e8[0].decUI;
    NVar4 = (NodeKind)local_d8;
    if (local_d8._1_1_ != EmptyKind) {
      LHS.twine = (Twine *)local_e8;
      NVar4 = TwineKind;
    }
    if (cStack_9f != '\x01') {
      local_a0 = TwineKind;
    }
    CVar1._4_4_ = uStack_ac;
    CVar1.decUI = local_b0;
    CVar5.twine = (Twine *)&local_b0;
    if (cStack_9f == '\x01') {
      CVar5 = CVar1;
    }
    Twine::Twine(&local_c8,LHS,NVar4,CVar5,local_a0);
  }
  setTriple(this,&local_c8);
  return;
}

Assistant:

void Triple::setVendorName(StringRef Str) {
  setTriple(getArchName() + "-" + Str + "-" + getOSAndEnvironmentName());
}